

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXExportNode.cpp
# Opt level: O0

void __thiscall
Assimp::FBX::Node::End(Node *this,StreamWriterLE *s,bool binary,int indent,bool has_children)

{
  streamoff sVar1;
  string local_1e0;
  fpos local_1c0 [32];
  ostringstream local_1a0 [8];
  ostringstream ss;
  bool has_children_local;
  int indent_local;
  bool binary_local;
  StreamWriterLE *s_local;
  Node *this_local;
  
  if (binary) {
    EndBinary(this,s,has_children);
  }
  else {
    std::__cxx11::ostringstream::ostringstream(local_1a0);
    EndAscii(this,(ostream *)local_1a0,indent,has_children);
    local_1c0._0_16_ = std::ostream::tellp();
    sVar1 = std::fpos::operator_cast_to_long(local_1c0);
    if (0 < sVar1) {
      std::__cxx11::ostringstream::str();
      StreamWriter<false,_false>::PutString(s,&local_1e0);
      std::__cxx11::string::~string((string *)&local_1e0);
    }
    std::__cxx11::ostringstream::~ostringstream(local_1a0);
  }
  return;
}

Assistant:

void FBX::Node::End(
    Assimp::StreamWriterLE &s,
    bool binary, int indent,
    bool has_children
) {
    if (binary) {
        EndBinary(s, has_children);
    } else {
        std::ostringstream ss;
        EndAscii(ss, indent, has_children);
        if (ss.tellp() > 0)
            s.PutString(ss.str());
    }
}